

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_avx::forward(Cast_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _d;
  int _elempack;
  _func_int *p_Var2;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  _func_int **pp_Var7;
  undefined1 auVar8 [32];
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  unsigned_short uVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  uint uVar16;
  void *pvVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  int iVar22;
  ulong uVar23;
  size_t sVar24;
  uint uVar25;
  long lVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  uint uVar35;
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  p_Var2 = this->_vptr_Cast_x86_avx[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var2) == *(int *)(&this->field_0xd4 + (long)p_Var2)) {
    iVar13 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar13 = bottom_blob->w;
      iVar1 = bottom_blob->h;
      iVar22 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar13;
      top_blob->h = iVar1;
      top_blob->d = iVar22;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      iVar13 = 0;
    }
  }
  else {
    iVar1 = bottom_blob->w;
    iVar22 = bottom_blob->h;
    _d = bottom_blob->d;
    uVar16 = bottom_blob->c;
    iVar13 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar24 = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var2)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var2) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx + (long)p_Var2),bottom_blob,top_blob,
                      opt);
      }
      sVar24 = sVar24 * 4;
      break;
    case 2:
    case 4:
      sVar24 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar24 = bottom_blob->elemsize;
    }
    switch(iVar13) {
    case 1:
      Mat::create(top_blob,iVar1,sVar24,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar1,iVar22,sVar24,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar1,iVar22,uVar16,sVar24,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar1,iVar22,_d,uVar16,sVar24,_elempack,opt->blob_allocator);
    }
    iVar13 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 1) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 2)) {
        iVar13 = cpu_support_x86_f16c();
        if (iVar13 == 0) {
          iVar13 = bottom_blob->c;
          if (0 < (long)iVar13) {
            iVar14 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar20 = 0;
            do {
              if (0 < iVar14) {
                sVar24 = top_blob->cstep;
                sVar4 = bottom_blob->cstep;
                sVar5 = top_blob->elemsize;
                pvVar15 = top_blob->data;
                sVar6 = bottom_blob->elemsize;
                pvVar17 = bottom_blob->data;
                lVar26 = 0;
                do {
                  uVar12 = float32_to_float16(*(float *)((long)pvVar17 +
                                                        lVar26 * 4 + sVar4 * sVar6 * lVar20));
                  *(unsigned_short *)((long)pvVar15 + lVar26 * 2 + sVar24 * sVar5 * lVar20) = uVar12
                  ;
                  lVar26 = lVar26 + 1;
                } while (iVar14 != (int)lVar26);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 != iVar13);
          }
        }
        else {
          cast_fp32_to_fp16_sse_f16c(bottom_blob,top_blob,opt);
        }
      }
      auVar30 = in_ZMM5._0_16_;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 2) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1)) {
        iVar13 = cpu_support_x86_f16c();
        auVar30 = in_ZMM5._0_16_;
        if (iVar13 == 0) {
          iVar13 = bottom_blob->c;
          if (0 < (long)iVar13) {
            iVar14 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar20 = 0;
            do {
              if (0 < iVar14) {
                sVar24 = top_blob->cstep;
                sVar4 = bottom_blob->cstep;
                sVar5 = top_blob->elemsize;
                pvVar15 = top_blob->data;
                sVar6 = bottom_blob->elemsize;
                pvVar17 = bottom_blob->data;
                lVar26 = 0;
                do {
                  fVar27 = float16_to_float32(*(unsigned_short *)
                                               ((long)pvVar17 + lVar26 * 2 + sVar4 * sVar6 * lVar20)
                                             );
                  *(float *)((long)pvVar15 + lVar26 * 4 + sVar24 * sVar5 * lVar20) = fVar27;
                  lVar26 = lVar26 + 1;
                } while (iVar14 != (int)lVar26);
              }
              auVar30 = in_ZMM5._0_16_;
              lVar20 = lVar20 + 1;
            } while (lVar20 != iVar13);
          }
        }
        else {
          cast_fp16_to_fp32_sse_f16c(bottom_blob,top_blob,opt);
        }
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 3) &&
         (0 < (int)uVar16 && *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1))
      {
        uVar25 = _d * _elempack * iVar22 * iVar1;
        pvVar15 = bottom_blob->data;
        sVar24 = bottom_blob->cstep;
        pvVar17 = top_blob->data;
        sVar4 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        sVar6 = bottom_blob->elemsize;
        uVar19 = 0;
        do {
          if (0 < (int)uVar25) {
            uVar23 = 0;
            do {
              *(float *)((long)pvVar17 + uVar23 * 4) = (float)(int)*(char *)((long)pvVar15 + uVar23)
              ;
              uVar23 = uVar23 + 1;
            } while (uVar25 != uVar23);
          }
          uVar19 = uVar19 + 1;
          pvVar17 = (void *)((long)pvVar17 + sVar4 * sVar5);
          pvVar15 = (void *)((long)pvVar15 + sVar24 * sVar6);
        } while (uVar19 != uVar16);
      }
      auVar11 = _DAT_0054fbe0;
      auVar10 = _DAT_0054fbc0;
      pp_Var7 = this->_vptr_Cast_x86_avx;
      p_Var2 = pp_Var7[-3];
      if (((*(int *)(&this->field_0xd0 + (long)p_Var2) == 1) &&
          (*(int *)(&this->field_0xd4 + (long)p_Var2) == 4)) &&
         (iVar13 = bottom_blob->c, 0 < (long)iVar13)) {
        uVar25 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        pvVar15 = bottom_blob->data;
        sVar24 = bottom_blob->elemsize;
        sVar4 = top_blob->elemsize;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = (ulong)uVar25 - 1;
        auVar28 = vpshufd_avx(auVar28,0x44);
        sVar5 = bottom_blob->cstep;
        sVar6 = top_blob->cstep;
        lVar20 = (long)top_blob->data + 0xe;
        lVar26 = 0;
        uVar19 = auVar28._0_8_;
        auVar29._0_8_ = uVar19 ^ 0x8000000000000000;
        auVar29._8_4_ = auVar28._8_4_;
        uVar16 = auVar28._12_4_;
        auVar29._12_4_ = uVar16 ^ 0x80000000;
        auVar30 = vpcmpeqd_avx(auVar30,auVar30);
        do {
          if (0 < (int)uVar25) {
            uVar23 = 0;
            do {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar23;
              auVar28 = vpshufd_avx(auVar31,0x44);
              auVar33._16_16_ = auVar28;
              auVar33._0_16_ = auVar28;
              auVar8 = vorps_avx(auVar33,auVar10);
              auVar33 = vorps_avx(auVar33,auVar11);
              auVar32._0_8_ = auVar33._16_8_ ^ 0x8000000000000000;
              auVar32._8_4_ = auVar33._24_4_;
              auVar32._12_4_ = auVar33._28_4_ ^ 0x80000000;
              auVar32 = vpcmpgtq_avx(auVar32,auVar29);
              auVar36._0_8_ = uVar19 ^ 0x8000000000000000;
              auVar36._8_4_ = auVar29._8_4_;
              auVar36._12_4_ = uVar16 ^ 0x80000000;
              uVar9 = auVar33._0_8_;
              auVar38._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar34._8_4_ = auVar33._8_4_;
              auVar38._8_4_ = auVar34._8_4_;
              uVar35 = auVar33._12_4_;
              auVar38._12_4_ = uVar35 ^ 0x80000000;
              auVar28 = vpcmpgtq_avx(auVar38,auVar36);
              auVar28 = vpackssdw_avx(auVar28,auVar32);
              auVar39._0_8_ = auVar8._16_8_ ^ 0x8000000000000000;
              auVar39._8_4_ = auVar8._24_4_;
              auVar39._12_4_ = auVar8._28_4_ ^ 0x80000000;
              auVar36 = vpcmpgtq_avx(auVar39,auVar29);
              auVar44._0_8_ = uVar19 ^ 0x8000000000000000;
              auVar44._8_4_ = auVar29._8_4_;
              auVar44._12_4_ = uVar16 ^ 0x80000000;
              auVar46._0_8_ = auVar8._0_8_ ^ 0x8000000000000000;
              auVar42._8_4_ = auVar8._8_4_;
              auVar46._8_4_ = auVar42._8_4_;
              auVar46._12_4_ = auVar8._12_4_ ^ 0x80000000;
              auVar31 = vpcmpgtq_avx(auVar46,auVar44);
              auVar31 = vpackssdw_avx(auVar31,auVar36);
              auVar28 = vpackssdw_avx(auVar31 ^ auVar30,auVar28 ^ auVar30);
              auVar31 = vpmovsxwd_avx(auVar28);
              auVar38 = vpunpckhwd_avx(auVar28,auVar28);
              auVar37._16_16_ = auVar38;
              auVar37._0_16_ = auVar31;
              auVar33 = vmaskmovps_avx(auVar37,*(undefined1 (*) [32])((long)pvVar15 + uVar23 * 4));
              if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -0xe + uVar23 * 2) = auVar33._2_2_;
              }
              auVar45._8_4_ = auVar29._8_4_;
              auVar45._0_8_ = uVar19 ^ 0x8000000000000000;
              auVar45._12_4_ = uVar16 ^ 0x80000000;
              auVar42._0_8_ = auVar8._0_8_ ^ 0x8000000000000000;
              auVar42._12_4_ = auVar8._12_4_ ^ 0x80000000;
              auVar28 = vpcmpgtq_avx(auVar42,auVar45);
              auVar28 = vpackssdw_avx(auVar28,auVar28);
              auVar28 = vpackssdw_avx(auVar28 ^ auVar30,auVar28 ^ auVar30);
              if ((auVar28 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -0xc + uVar23 * 2) = auVar33._6_2_;
              }
              auVar28 = vpackssdw_avx(auVar36,auVar36);
              auVar28 = vpackssdw_avx(auVar28 ^ auVar30,auVar28 ^ auVar30);
              if ((auVar28 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -10 + uVar23 * 2) = auVar33._10_2_;
              }
              auVar28 = vpackssdw_avx(auVar36,auVar36);
              auVar28 = vpackssdw_avx(auVar28 ^ auVar30,auVar28 ^ auVar30);
              if ((auVar28 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -8 + uVar23 * 2) = auVar33._14_2_;
              }
              auVar40._8_4_ = auVar29._8_4_;
              auVar40._0_8_ = uVar19 ^ 0x8000000000000000;
              auVar40._12_4_ = uVar16 ^ 0x80000000;
              auVar43._8_4_ = auVar34._8_4_;
              auVar43._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar43._12_4_ = uVar35 ^ 0x80000000;
              auVar28 = vpcmpgtq_avx(auVar43,auVar40);
              auVar28 = vpackssdw_avx(auVar28,auVar28);
              auVar28 = vpackssdw_avx(auVar28 ^ auVar30,auVar28 ^ auVar30);
              if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -6 + uVar23 * 2) = auVar33._18_2_;
              }
              auVar41._8_4_ = auVar29._8_4_;
              auVar41._0_8_ = uVar19 ^ 0x8000000000000000;
              auVar41._12_4_ = uVar16 ^ 0x80000000;
              auVar34._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar34._12_4_ = uVar35 ^ 0x80000000;
              auVar28 = vpcmpgtq_avx(auVar34,auVar41);
              auVar28 = vpackssdw_avx(auVar28,auVar28);
              auVar28 = vpackssdw_avx(auVar28 ^ auVar30,auVar28 ^ auVar30);
              if ((auVar28 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -4 + uVar23 * 2) = auVar33._22_2_;
              }
              auVar28 = vpackssdw_avx(auVar32,auVar32);
              auVar28 = vpackssdw_avx(auVar28 ^ auVar30,auVar28 ^ auVar30);
              if ((auVar28 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + -2 + uVar23 * 2) = auVar33._26_2_;
              }
              auVar28 = vpackssdw_avx(auVar32,auVar32);
              auVar28 = vpackssdw_avx(auVar28 ^ auVar30,auVar28 ^ auVar30);
              if ((auVar28 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(lVar20 + uVar23 * 2) = auVar33._30_2_;
              }
              uVar23 = uVar23 + 8;
            } while ((uVar25 + 7 & 0xfffffff8) != uVar23);
          }
          lVar26 = lVar26 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar24 * sVar5);
          lVar20 = lVar20 + sVar4 * sVar6;
        } while (lVar26 != iVar13);
      }
      p_Var2 = pp_Var7[-3];
      iVar13 = 0;
      if (((*(int *)(&this->field_0xd0 + (long)p_Var2) == 4) &&
          (iVar13 = 0, *(int *)(&this->field_0xd4 + (long)p_Var2) == 1)) &&
         (iVar1 = bottom_blob->c, 0 < (long)iVar1)) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar20 = 0;
        iVar13 = 0;
        do {
          pauVar18 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar20 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar21 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar20 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 8) {
            uVar25 = 0;
          }
          else {
            iVar22 = 7;
            do {
              auVar30 = vlddqu_avx(*pauVar18);
              auVar28 = vpunpcklwd_avx(ZEXT816(0) << 0x40,auVar30);
              auVar30 = vpunpckhwd_avx(ZEXT816(0) << 0x40,auVar30);
              pauVar21[1] = auVar30;
              *pauVar21 = auVar28;
              pauVar18 = pauVar18 + 1;
              pauVar21 = pauVar21 + 2;
              iVar22 = iVar22 + 8;
              uVar25 = uVar16 & 0xfffffff8;
            } while (iVar22 < (int)uVar16);
          }
          if (uVar16 - uVar25 != 0 && (int)uVar25 <= (int)uVar16) {
            lVar26 = 0;
            do {
              *(uint *)(*pauVar21 + lVar26 * 4) = (uint)*(ushort *)(*pauVar18 + lVar26 * 2) << 0x10;
              lVar26 = lVar26 + 1;
            } while (uVar16 - uVar25 != (int)lVar26);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar1);
      }
    }
  }
  return iVar13;
}

Assistant:

int Cast_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}